

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O1

int aom_noise_strength_solver_solve(aom_noise_strength_solver_t *solver)

{
  double *__src;
  int iVar1;
  double *__dest;
  uint uVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  long lVar6;
  int iVar7;
  size_t size;
  long lVar8;
  double dVar9;
  
  iVar1 = solver->num_bins;
  lVar8 = (long)iVar1;
  iVar3 = solver->num_equations;
  __src = (solver->eqns).A;
  size = lVar8 * lVar8 * 8;
  __dest = (double *)aom_malloc(size);
  if (__dest == (double *)0x0) {
    aom_noise_strength_solver_solve_cold_1();
    iVar1 = 0;
  }
  else {
    memcpy(__dest,__src,size);
    if (0 < iVar1) {
      dVar9 = ((double)iVar3 + (double)iVar3) / (double)iVar1;
      uVar2 = 0;
      iVar3 = 1;
      lVar6 = 0;
      pdVar5 = __dest;
      do {
        iVar4 = iVar1 + -1;
        if (iVar3 < iVar1 + -1) {
          iVar4 = iVar3;
        }
        iVar7 = 1;
        if (1 < (int)lVar6) {
          iVar7 = (int)lVar6;
        }
        lVar6 = lVar6 + 1;
        iVar7 = iVar7 + uVar2 + -1;
        __dest[iVar7] = __dest[iVar7] - dVar9;
        pdVar5[uVar2] = pdVar5[uVar2] + dVar9 + dVar9;
        __dest[(int)(iVar4 + uVar2)] = __dest[(int)(iVar4 + uVar2)] - dVar9;
        pdVar5 = pdVar5 + 1;
        uVar2 = uVar2 + iVar1;
        iVar3 = iVar3 + 1;
      } while (lVar8 != lVar6);
    }
    if (0 < iVar1) {
      dVar9 = solver->total;
      iVar3 = solver->num_equations;
      pdVar5 = (solver->eqns).b;
      iVar4 = 0;
      lVar6 = 0;
      do {
        __dest[iVar4] = __dest[iVar4] + 0.0001220703125;
        pdVar5[lVar6] = pdVar5[lVar6] + (dVar9 / (double)iVar3) * 0.0001220703125;
        lVar6 = lVar6 + 1;
        iVar4 = iVar4 + iVar1 + 1;
      } while (lVar8 != lVar6);
    }
    (solver->eqns).A = __dest;
    iVar1 = equation_system_solve(&solver->eqns);
    (solver->eqns).A = __src;
    aom_free(__dest);
  }
  return iVar1;
}

Assistant:

int aom_noise_strength_solver_solve(aom_noise_strength_solver_t *solver) {
  // Add regularization proportional to the number of constraints
  const int n = solver->num_bins;
  const double kAlpha = 2.0 * (double)(solver->num_equations) / n;
  int result = 0;
  double mean = 0;

  // Do this in a non-destructive manner so it is not confusing to the caller
  double *old_A = solver->eqns.A;
  double *A = (double *)aom_malloc(sizeof(*A) * n * n);
  if (!A) {
    fprintf(stderr, "Unable to allocate copy of A\n");
    return 0;
  }
  memcpy(A, old_A, sizeof(*A) * n * n);

  for (int i = 0; i < n; ++i) {
    const int i_lo = AOMMAX(0, i - 1);
    const int i_hi = AOMMIN(n - 1, i + 1);
    A[i * n + i_lo] -= kAlpha;
    A[i * n + i] += 2 * kAlpha;
    A[i * n + i_hi] -= kAlpha;
  }

  // Small regularization to give average noise strength
  mean = solver->total / solver->num_equations;
  for (int i = 0; i < n; ++i) {
    A[i * n + i] += 1.0 / 8192.;
    solver->eqns.b[i] += mean / 8192.;
  }
  solver->eqns.A = A;
  result = equation_system_solve(&solver->eqns);
  solver->eqns.A = old_A;

  aom_free(A);
  return result;
}